

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O3

void __thiscall
qclab::dense::SquareMatrix<double>::SquareMatrix(SquareMatrix<double> *this,int64_t size)

{
  double *pdVar1;
  
  this->size_ = size;
  if (size == 0) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                  ,0x12,"auto qclab::dense::alloc_unique_array(const int64_t) [T = double]");
  }
  pdVar1 = (double *)operator_new__(-(ulong)((ulong)(size * size) >> 0x3d != 0) | size * size * 8);
  (this->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = pdVar1;
  if (0 < size) {
    return;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/SquareMatrix.hpp"
                ,0x2d,"qclab::dense::SquareMatrix<double>::SquareMatrix(const int64_t) [T = double]"
               );
}

Assistant:

SquareMatrix( const int64_t size )
        : size_( size )
        , data_( alloc_unique_array< T >( size * size ) )
        {
          assert( size > 0 ) ;
        }